

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,list *vec)

{
  iterator __position;
  size_t sVar1;
  long lVar2;
  double *pdVar3;
  object_cref2 x;
  rvalue_from_python_stage1_data rVar4;
  object_base local_80;
  ulong local_78;
  object_base local_70;
  PyObject *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  double local_58;
  _object *local_50;
  rvalue_from_python_stage1_data local_48;
  double local_38;
  
  sVar1 = PyObject_Size((vec->super_list_base).super_object.super_object_base.m_ptr);
  lVar2 = PyErr_Occurred();
  if (lVar2 != 0) {
    boost::python::throw_error_already_set();
  }
  this->max_size__ = sVar1;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  local_78 = 0;
  if (sVar1 != 0) {
    local_60 = &this->container__;
    do {
      local_68 = boost::python::api::object_initializer_impl<false,_false>::get<unsigned_long>
                           (&local_78);
      local_70.m_ptr = (vec->super_list_base).super_object.super_object_base.m_ptr;
      (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + 1;
      lVar2 = local_68->ob_refcnt;
      local_68->ob_refcnt = lVar2 + 1;
      if (lVar2 < 0) {
LAB_001528c4:
        __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                      "boost::python::api::object_base::~object_base()");
      }
      local_68->ob_refcnt = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc(local_68);
      }
      boost::python::api::getitem((object *)&local_80,(object *)&local_70);
      local_50 = local_80.m_ptr;
      rVar4 = (rvalue_from_python_stage1_data)
              boost::python::converter::rvalue_from_python_stage1
                        (local_80.m_ptr,
                         boost::python::converter::detail::registered_base<double_const_volatile&>::
                         converters);
      pdVar3 = &local_38;
      local_48 = rVar4;
      if ((double *)rVar4.convertible != &local_38) {
        pdVar3 = (double *)
                 boost::python::converter::rvalue_from_python_stage2
                           (local_50,&local_48,
                            boost::python::converter::detail::
                            registered_base<double_const_volatile&>::converters);
      }
      local_58 = *pdVar3;
      __position._M_current =
           (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_60,__position,&local_58);
      }
      else {
        *__position._M_current = local_58;
        (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((local_80.m_ptr)->ob_refcnt < 1) goto LAB_001528c4;
      lVar2 = (local_80.m_ptr)->ob_refcnt + -1;
      (local_80.m_ptr)->ob_refcnt = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      if (local_68->ob_refcnt < 1) goto LAB_001528c4;
      lVar2 = local_68->ob_refcnt + -1;
      local_68->ob_refcnt = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      if ((local_70.m_ptr)->ob_refcnt < 1) goto LAB_001528c4;
      lVar2 = (local_70.m_ptr)->ob_refcnt + -1;
      (local_70.m_ptr)->ob_refcnt = lVar2;
      if (lVar2 == 0) {
        _Py_Dealloc();
      }
      local_78 = local_78 + 1;
    } while (local_78 < this->max_size__);
  }
  return;
}

Assistant:

vector(boost::python::list vec): max_size__{static_cast<size_t>(boost::python::len(vec))} {
          for(size_t i = 0 ; i < max_size__; i++) container__.push_back(boost::python::extract<element_t>(vec[i]));
      }